

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::exportToFile(Board *this,ofstream *outputFile)

{
  bool bVar1;
  pointer pBVar2;
  ostream *poVar3;
  __normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_> local_30;
  __normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_> local_28;
  iterator it;
  char direction;
  ofstream *outputFile_local;
  Board *this_local;
  
  local_28._M_current = (Block *)std::vector<Block,_std::allocator<Block>_>::begin(&this->blocks);
  while( true ) {
    local_30._M_current = (Block *)std::vector<Block,_std::allocator<Block>_>::end(&this->blocks);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pBVar2 = __gnu_cxx::__normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_>::
             operator->(&local_28);
    if (pBVar2->direction == 0) {
      it._M_current._7_1_ = 'h';
    }
    else {
      it._M_current._7_1_ = 'v';
    }
    pBVar2 = __gnu_cxx::__normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_>::
             operator->(&local_28);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)outputFile,pBVar2->row + 1);
    poVar3 = std::operator<<(poVar3," ");
    pBVar2 = __gnu_cxx::__normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_>::
             operator->(&local_28);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pBVar2->column + 1);
    poVar3 = std::operator<<(poVar3," ");
    pBVar2 = __gnu_cxx::__normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_>::
             operator->(&local_28);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pBVar2->length);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,it._M_current._7_1_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Block_*,_std::vector<Block,_std::allocator<Block>_>_>::operator++
              (&local_28,0);
  }
  return;
}

Assistant:

void Board::exportToFile(std::ofstream &outputFile) {
    char direction;

    // Iterate over the blocks and write to the given output file.
    for (vector<Block>::iterator it = this->blocks.begin(); it != this->blocks.end(); it++) {
        if (it->direction == HORIZONTAL) {
            direction = 'h';
        } else {
            direction = 'v';
        }

        outputFile << it->row + 1 << " " << it->column + 1 << " " << it->length << " " << direction << endl;
    }
}